

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

double __thiscall AngleSet::overlap(AngleSet *this,double sTheta,double eTheta)

{
  double dVar1;
  double dVar2;
  
  if (eTheta <= sTheta) {
    dVar2 = _overlap(this,sTheta,6.283185307179586);
    dVar1 = _overlap(this,0.0,eTheta);
    dVar1 = dVar1 + dVar2;
  }
  else {
    dVar1 = _overlap(this,sTheta,eTheta);
  }
  return dVar1 / ((double)(-(ulong)(sTheta < eTheta) & (ulong)-sTheta |
                          ~-(ulong)(sTheta < eTheta) & (ulong)(6.283185307179586 - sTheta)) + eTheta
                 );
}

Assistant:

double AngleSet::overlap(double sTheta, double eTheta)
{
	double o;

	if (eTheta > sTheta) {
		o = _overlap(sTheta, eTheta);

	}
	else {
		o = _overlap(sTheta, TWOPI);
		o += _overlap(0, eTheta);
	} //end-else

	return o / ArcLength(sTheta, eTheta);
}